

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_dupi_vec(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,tcg_target_long arg)

{
  int iVar1;
  int vex_l;
  tcg_target_long arg_local;
  TCGReg ret_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  iVar1 = 0;
  if (type == TCG_TYPE_V256) {
    iVar1 = 0x80000;
  }
  if (arg == 0) {
    tcg_out_vex_modrm(s,0x5ef,ret,ret,ret);
  }
  else if (arg == -1) {
    tcg_out_vex_modrm(s,iVar1 + 0x574,ret,ret,ret);
  }
  else {
    if (type == TCG_TYPE_V64) {
      tcg_out_vex_modrm_pool(s,0x2017e,ret);
    }
    else if (have_avx2_tricore) {
      tcg_out_vex_modrm_pool(s,iVar1 + 0x659,ret);
    }
    else {
      tcg_out_vex_modrm_pool(s,0x40112,ret);
    }
    new_pool_label(s,arg,2,s->code_ptr + -4,-4);
  }
  return;
}

Assistant:

static void tcg_out_dupi_vec(TCGContext *s, TCGType type,
                             TCGReg ret, tcg_target_long arg)
{
    int vex_l = (type == TCG_TYPE_V256 ? P_VEXL : 0);

    if (arg == 0) {
        tcg_out_vex_modrm(s, OPC_PXOR, ret, ret, ret);
        return;
    }
    if (arg == -1) {
        tcg_out_vex_modrm(s, OPC_PCMPEQB + vex_l, ret, ret, ret);
        return;
    }

    if (TCG_TARGET_REG_BITS == 64) {
        if (type == TCG_TYPE_V64) {
            tcg_out_vex_modrm_pool(s, OPC_MOVQ_VqWq, ret);
        } else if (have_avx2) {
            tcg_out_vex_modrm_pool(s, OPC_VPBROADCASTQ + vex_l, ret);
        } else {
            tcg_out_vex_modrm_pool(s, OPC_MOVDDUP, ret);
        }
        new_pool_label(s, arg, R_386_PC32, s->code_ptr - 4, -4);
    } else {
        if (have_avx2) {
            tcg_out_vex_modrm_pool(s, OPC_VPBROADCASTW + vex_l, ret);
        } else {
            tcg_out_vex_modrm_pool(s, OPC_VBROADCASTSS, ret);
        }
        new_pool_label(s, arg, R_386_32, s->code_ptr - 4, 0);
    }
}